

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

UObject * __thiscall
icu_63::SimpleFactory::create
          (SimpleFactory *this,ICUServiceKey *key,ICUService *service,UErrorCode *status)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int32_t iVar5;
  UObject *unaff_R15;
  bool bVar6;
  UnicodeString temp;
  UnicodeString local_60;
  UnicodeString *text;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_60.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f7be0;
    local_60.fUnion.fStackFields.fLengthAndFlags = 2;
    iVar4 = (*(key->super_UObject)._vptr_UObject[5])(key,&local_60);
    text = (UnicodeString *)CONCAT44(extraout_var,iVar4);
    uVar1 = (this->_id).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar4 = (this->_id).fUnion.fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar1 >> 5;
      }
      sVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar5 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar2 >> 5;
      }
      bVar6 = false;
      if ((((int)sVar2 & 1U) == 0) && (bVar6 = false, iVar4 == iVar5)) {
        UVar3 = UnicodeString::doEquals(&this->_id,text,iVar4);
        bVar6 = UVar3 != '\0';
      }
    }
    else {
      bVar6 = (bool)(*(byte *)&text->fUnion & 1);
    }
    if (bVar6 != false) {
      iVar4 = (*(service->super_ICUNotifier)._vptr_ICUNotifier[0xe])(service,this->_instance);
      unaff_R15 = (UObject *)CONCAT44(extraout_var_00,iVar4);
    }
    UnicodeString::~UnicodeString(&local_60);
    if (bVar6 != false) {
      return unaff_R15;
    }
  }
  return (UObject *)0x0;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result) const 
{
    return getDisplayName(id, result, Locale::getDefault());
}